

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rect.c
# Opt level: O0

void add_rect(nhrect *r)

{
  nhrect *pnVar1;
  nhrect *r_local;
  
  if (rect_cnt < 0x32) {
    pnVar1 = get_rect(r);
    if (pnVar1 == (nhrect *)0x0) {
      rect[rect_cnt] = *r;
      rect_cnt = rect_cnt + 1;
    }
  }
  else if (flags.debug != '\0') {
    pline("MAXRECT may be too small.");
  }
  return;
}

Assistant:

void add_rect(struct nhrect *r)
{
	if (rect_cnt >= MAXRECT) {
		if (wizard) pline("MAXRECT may be too small.");
		return;
	}
	/* Check that this struct nhrect is not included in another one */
	if (get_rect(r))
	    return;
	rect[rect_cnt] = *r;
	rect_cnt++;
}